

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

int google::protobuf::descriptor_unittest::AllowUnknownDependenciesTest_PlaceholderTypes_Test::
    AddToRegistry(void)

{
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<google::protobuf::descriptor_unittest::AllowUnknownDependenciesTest>
  *this_01;
  TestMetaFactoryBase<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
  *meta_factory;
  allocator<char> local_c3;
  allocator<char> local_c2;
  allocator<char> local_c1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  size_type local_b8;
  char local_b0 [8];
  undefined8 uStack_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  size_type local_98;
  char local_90 [8];
  undefined8 uStack_88;
  CodeLocation local_80;
  CodeLocation local_58;
  string local_30;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"AllowUnknownDependenciesTest",&local_c1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
             ,&local_c2);
  local_58.file._M_string_length = local_98;
  local_58.file._M_dataplus._M_p = (pointer)&local_58.file.field_2;
  if (local_a0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90) {
    local_58.file.field_2._8_8_ = uStack_88;
  }
  else {
    local_58.file._M_dataplus._M_p = (pointer)local_a0;
  }
  local_98 = 0;
  local_90[0] = '\0';
  local_58.line = 0xe36;
  local_a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_90;
  this_01 = testing::internal::ParameterizedTestSuiteRegistry::
            GetTestSuitePatternHolder<google::protobuf::descriptor_unittest::AllowUnknownDependenciesTest>
                      (this_00,&local_30,&local_58);
  meta_factory = (TestMetaFactoryBase<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
                  *)operator_new(8);
  meta_factory->_vptr_TestMetaFactoryBase = (_func_int **)&PTR__TestMetaFactoryBase_01600700;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
             ,&local_c3);
  local_80.file._M_string_length = local_b8;
  local_80.file._M_dataplus._M_p = (pointer)&local_80.file.field_2;
  if (local_c0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0) {
    local_80.file.field_2._8_8_ = uStack_a8;
  }
  else {
    local_80.file._M_dataplus._M_p = (pointer)local_c0;
  }
  local_b8 = 0;
  local_b0[0] = '\0';
  local_80.line = 0xe36;
  local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_b0;
  testing::internal::
  ParameterizedTestSuiteInfo<google::protobuf::descriptor_unittest::AllowUnknownDependenciesTest>::
  AddTestPattern(this_01,"AllowUnknownDependenciesTest","PlaceholderTypes",meta_factory,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_30);
  return 0;
}

Assistant:

TEST_P(AllowUnknownDependenciesTest, PlaceholderTypes) {
  ASSERT_EQ(FieldDescriptor::TYPE_MESSAGE, bar_field_->type());
  EXPECT_EQ(bar_type_, bar_field_->message_type());
  EXPECT_FALSE(bar_type_->is_placeholder());

  ASSERT_EQ(FieldDescriptor::TYPE_MESSAGE, baz_field_->type());
  const Descriptor* baz_type = baz_field_->message_type();
  EXPECT_EQ("Baz", baz_type->name());
  EXPECT_EQ("Baz", baz_type->full_name());
  EXPECT_EQ(0, baz_type->extension_range_count());
  EXPECT_TRUE(baz_type->is_placeholder());

  ASSERT_EQ(FieldDescriptor::TYPE_ENUM, moo_field_->type());
  const EnumDescriptor* moo_type = moo_field_->enum_type();
  EXPECT_EQ("Moo", moo_type->name());
  EXPECT_EQ("corge.Moo", moo_type->full_name());
  EXPECT_TRUE(moo_type->is_placeholder());
  // Placeholder enum values should not be findable.
  EXPECT_EQ(moo_type->FindValueByNumber(0), nullptr);

  // Placeholder types should not be findable.
  EXPECT_EQ(bar_type_, pool_->FindMessageTypeByName(bar_type_->full_name()));
  EXPECT_TRUE(pool_->FindMessageTypeByName(baz_type->full_name()) == nullptr);
  EXPECT_TRUE(pool_->FindEnumTypeByName(moo_type->full_name()) == nullptr);
}